

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O3

int Sbd_ManCheckConst(Sbd_Man_t *p,int Pivot)

{
  word *pwVar1;
  word **pVarSims;
  int *piVar2;
  uint uVar3;
  int iVar4;
  sat_solver *psVar5;
  void *pvVar6;
  Vec_Int_t *pVVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  undefined4 *puVar11;
  ulong *puVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  int nCares [2];
  timespec ts;
  uint local_78 [4];
  ulong local_68;
  undefined4 *local_60;
  ulong local_58;
  word *local_50;
  timespec local_48;
  ulong local_38;
  
  uVar3 = p->pPars->nWords * Pivot;
  if ((((int)uVar3 < 0) || (p->vSims[0]->nSize <= (int)uVar3)) || (p->vSims[2]->nSize <= (int)uVar3)
     ) {
LAB_0053ba72:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                  ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
  }
  if ((Pivot < 0) || (p->vObj2Var->nSize <= Pivot)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pwVar1 = p->vSims[0]->pArray;
  uVar15 = (ulong)uVar3;
  puVar12 = p->vSims[2]->pArray + uVar15;
  local_38 = (ulong)(uint)Pivot;
  local_58 = (ulong)(uint)p->vObj2Var->pArray[local_38];
  local_78[0] = 0;
  local_78[1] = 0;
  iVar4 = clock_gettime(3,&local_48);
  if (iVar4 < 0) {
    lVar9 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  psVar5 = Sbd_ManSatSolver(p->pSat,p->pGia,p->vMirrors,Pivot,p->vWinObjs,p->vObj2Var,p->vTfo,
                            p->vRoots,0);
  p->pSat = psVar5;
  iVar4 = clock_gettime(3,&local_48);
  if (iVar4 < 0) {
    lVar10 = -1;
  }
  else {
    lVar10 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  p->timeCnf = p->timeCnf + lVar10 + lVar9;
  if (p->pSat == (sat_solver *)0x0) {
    pVVar7 = p->vLutLevs;
    uVar3 = 0;
    if (pVVar7->nSize <= Pivot) goto LAB_0053b9b2;
  }
  else {
    p->vLits->nSize = 0;
    uVar17 = 0;
    do {
      if ((*puVar12 >> (uVar17 & 0x3f) & 1) == 0) {
        Vec_IntPush(p->vLits,(int)uVar17);
      }
      else {
        local_78[(pwVar1[uVar15] >> (uVar17 & 0x3f) & 1) != 0] =
             local_78[(pwVar1[uVar15] >> (uVar17 & 0x3f) & 1) != 0] + 1;
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != 0x40);
    uVar3 = local_78[0];
    uVar16 = local_78[1];
    if (0 < (int)local_78[0] && 0 < (int)local_78[1]) {
      return -1;
    }
    uVar14 = 1 - local_78[0];
    if (0 < (int)local_78[0]) {
      uVar14 = 0;
    }
    uVar13 = 1 - local_78[1];
    if (0 < (int)local_78[1]) {
      uVar13 = 0;
    }
    local_78[1] = uVar13;
    local_78[0] = uVar14;
    local_78[3] = Pivot;
    local_68 = uVar15;
    local_50 = pwVar1;
    if (p->pPars->fVeryVerbose != 0) {
      printf("Computing %d offset and %d onset minterms for node %d.\n",(ulong)uVar14,(ulong)uVar13,
             (ulong)(uint)Pivot);
    }
    iVar4 = uVar13 + uVar14;
    if (p->vLits->nSize < iVar4) {
      uVar15 = 0;
      do {
        if (iVar4 <= p->vLits->nSize) break;
        if ((int)uVar16 <= (int)uVar3 != ((local_50[local_68] >> (uVar15 & 0x3f) & 1) != 0)) {
          Vec_IntPush(p->vLits,(int)uVar15);
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != 0x40);
    }
    else {
      p->vLits->nSize = iVar4;
    }
    uVar3 = (uint)local_58;
    local_60 = (undefined4 *)malloc(0x10);
    uVar15 = 8;
    if (6 < uVar3) {
      uVar15 = (ulong)(uVar3 + 1);
    }
    local_60[1] = 0;
    uVar16 = 0;
    if ((int)uVar15 == 0) {
      pvVar6 = (void *)0x0;
    }
    else {
      pvVar6 = malloc((long)(int)uVar15 << 3);
    }
    *(void **)(local_60 + 2) = pvVar6;
    pVVar7 = p->vWinObjs;
    puVar11 = local_60;
    if (0 < pVVar7->nSize) {
      lVar9 = 0;
      do {
        uVar3 = pVVar7->pArray[lVar9];
        uVar16 = p->pPars->nWords * uVar3;
        if (((int)uVar16 < 0) || (p->vSims[0]->nSize <= (int)uVar16)) goto LAB_0053ba72;
        pwVar1 = p->vSims[0]->pArray;
        iVar4 = (int)uVar15;
        if ((int)lVar9 == iVar4) {
          if (iVar4 < 0x10) {
            if (*(void **)(puVar11 + 2) == (void *)0x0) {
              pvVar6 = malloc(0x80);
            }
            else {
              pvVar6 = realloc(*(void **)(puVar11 + 2),0x80);
            }
            *(void **)(local_60 + 2) = pvVar6;
            *local_60 = 0x10;
            uVar15 = 0x10;
            puVar11 = local_60;
          }
          else {
            uVar15 = (ulong)(uint)(iVar4 * 2);
            if (*(void **)(puVar11 + 2) == (void *)0x0) {
              pvVar6 = malloc(uVar15 * 8);
            }
            else {
              pvVar6 = realloc(*(void **)(puVar11 + 2),uVar15 * 8);
            }
            *(void **)(local_60 + 2) = pvVar6;
            puVar11 = local_60;
          }
        }
        else {
          pvVar6 = *(void **)(puVar11 + 2);
        }
        *(word **)((long)pvVar6 + lVar9 * 8) = pwVar1 + uVar16;
        if (uVar3 == local_78[3]) break;
        lVar9 = lVar9 + 1;
        pVVar7 = p->vWinObjs;
      } while (lVar9 < pVVar7->nSize);
      uVar16 = (uint)lVar9;
      uVar3 = (uint)local_58;
    }
    uVar15 = local_68;
    if (uVar16 != uVar3) {
      __assert_fail("i == PivotVar",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                    ,0x240,"int Sbd_ManCheckConst(Sbd_Man_t *, int)");
    }
    pVarSims = *(word ***)(puVar11 + 2);
    uVar3 = Sbd_ManCollectConstants(p->pSat,(int *)local_78,uVar3,pVarSims,p->vLits);
    if (pVarSims != (word **)0x0) {
      free(pVarSims);
    }
    free(local_60);
    uVar16 = local_78[3];
    if ((int)uVar3 < 0) {
      lVar9 = (long)p->vLits->nSize;
      if (0 < lVar9) {
        piVar2 = p->vLits->pArray;
        lVar10 = 0;
        do {
          iVar4 = piVar2[lVar10];
          puVar12[iVar4 >> 6] = puVar12[iVar4 >> 6] | 1L << ((byte)iVar4 & 0x3f);
          lVar10 = lVar10 + 1;
        } while (lVar9 != lVar10);
      }
      Sbd_ManPropagateControl(p,local_78[3]);
      uVar17 = *puVar12;
      uVar8 = 0;
      do {
        if ((uVar17 >> (uVar8 & 0x3f) & 1) != 0) {
          local_78[(local_50[uVar15] >> (uVar8 & 0x3f) & 1) != 0] =
               local_78[(local_50[uVar15] >> (uVar8 & 0x3f) & 1) != 0] + 1;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != 0x40);
      if ((0 < (int)local_78[0]) && (0 < (int)local_78[1])) {
        return -1;
      }
      __assert_fail("nCares[0] >= nMintCount && nCares[1] >= nMintCount",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                    ,0x262,"int Sbd_ManCheckConst(Sbd_Man_t *, int)");
    }
    if (p->pPars->fVeryVerbose != 0) {
      printf("Found stuck-at-%d node %d.\n",(ulong)uVar3,(ulong)local_78[3]);
    }
    pVVar7 = p->vLutLevs;
    if (pVVar7->nSize <= (int)uVar16) {
LAB_0053b9b2:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
  }
  pVVar7->pArray[local_38] = 0;
  p->nLuts[0] = p->nLuts[0] + 1;
  return uVar3;
}

Assistant:

int Sbd_ManCheckConst( Sbd_Man_t * p, int Pivot )
{
    int nMintCount = 1;
    Vec_Ptr_t * vSims;
    word * pSims = Sbd_ObjSim0( p, Pivot );
    word * pCtrl = Sbd_ObjSim2( p, Pivot );
    int PivotVar = Vec_IntEntry(p->vObj2Var, Pivot);
    int RetValue, i, iObj, Ind, fFindOnset, nCares[2] = {0};

    abctime clk = Abc_Clock();
    p->pSat = Sbd_ManSatSolver( p->pSat, p->pGia, p->vMirrors, Pivot, p->vWinObjs, p->vObj2Var, p->vTfo, p->vRoots, 0 );
    p->timeCnf += Abc_Clock() - clk;
    if ( p->pSat == NULL )
    {
        //if ( p->pPars->fVerbose )
        //    printf( "Found stuck-at-%d node %d.\n", 0, Pivot );
        Vec_IntWriteEntry( p->vLutLevs, Pivot, 0 );
        p->nLuts[0]++;
        return 0;
    }
    //return -1;
    //Sbd_ManPrintObj( p, Pivot );

    // count the number of on-set and off-set care-set minterms
    Vec_IntClear( p->vLits );
    for ( i = 0; i < 64; i++ )
        if ( Abc_TtGetBit(pCtrl, i) )
            nCares[Abc_TtGetBit(pSims, i)]++;
        else
            Vec_IntPush( p->vLits, i );
    fFindOnset = (int)(nCares[0] < nCares[1]);
    if ( nCares[0] >= nMintCount && nCares[1] >= nMintCount )
        return -1;
    // find how many do we need
    nCares[0] = nCares[0] < nMintCount ? nMintCount - nCares[0] : 0;
    nCares[1] = nCares[1] < nMintCount ? nMintCount - nCares[1] : 0;

    if ( p->pPars->fVeryVerbose )
        printf( "Computing %d offset and %d onset minterms for node %d.\n", nCares[0], nCares[1], Pivot );

    if ( Vec_IntSize(p->vLits) >= nCares[0] + nCares[1] )
        Vec_IntShrink( p->vLits, nCares[0] + nCares[1] );
    else
    {
        // collect places to insert new minterms
        for ( i = 0; i < 64 && Vec_IntSize(p->vLits) < nCares[0] + nCares[1]; i++ )
            if ( fFindOnset == Abc_TtGetBit(pSims, i) )
                Vec_IntPush( p->vLits, i );
    }
    // collect simulation pointers
    vSims = Vec_PtrAlloc( PivotVar + 1 );
    Vec_IntForEachEntry( p->vWinObjs, iObj, i )
    {
        Vec_PtrPush( vSims, Sbd_ObjSim0(p, iObj) );
        if ( iObj == Pivot )
            break;
    }
    assert( i == PivotVar );
    // compute patterns
    RetValue = Sbd_ManCollectConstants( p->pSat, nCares, PivotVar, (word **)Vec_PtrArray(vSims), p->vLits );
    // print computed miterms
    if ( 0 && RetValue < 0 )
    {
        Vec_Int_t * vPis = Vec_WecEntry(p->vDivLevels, 0);
        int i, k, Ind;
        printf( "Additional minterms:\n" );
        Vec_IntForEachEntry( p->vLits, Ind, k )
        {
            for ( i = 0; i < Vec_IntSize(vPis); i++ )
                printf( "%d", Abc_TtGetBit( (word *)Vec_PtrEntry(vSims, Vec_IntEntry(p->vWinObjs, i)), Ind ) );
            printf( "\n" );
        }
    }
    Vec_PtrFree( vSims );
    if ( RetValue >= 0 )
    {
        if ( p->pPars->fVeryVerbose )
            printf( "Found stuck-at-%d node %d.\n", RetValue, Pivot );
        Vec_IntWriteEntry( p->vLutLevs, Pivot, 0 );
        p->nLuts[0]++;
        return RetValue;
    }
    // set controlability of these minterms
    Vec_IntForEachEntry( p->vLits, Ind, i )
        Abc_TtSetBit( pCtrl, Ind );
    // propagate controlability to fanins for the TFI nodes starting from the pivot
    Sbd_ManPropagateControl( p, Pivot );
    // double check that we now have enough minterms
    for ( i = 0; i < 64; i++ )
        if ( Abc_TtGetBit(pCtrl, i) )
            nCares[Abc_TtGetBit(pSims, i)]++;
    assert( nCares[0] >= nMintCount && nCares[1] >= nMintCount );
    return -1;
}